

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void timer_synchronize(Emulator *e)

{
  u16 old_div_counter_00;
  Ticks TVar1;
  Bool BVar2;
  u16 old_div_counter;
  Ticks cpu_tick;
  Ticks delta_ticks;
  Emulator *e_local;
  
  if ((e->state).timer.sync_ticks < (e->state).ticks) {
    cpu_tick = (e->state).ticks - (e->state).timer.sync_ticks;
    (e->state).timer.sync_ticks = (e->state).ticks;
    if ((e->state).timer.on == FALSE) {
      (e->state).timer.div_counter = (e->state).timer.div_counter + (short)cpu_tick;
    }
    else {
      TVar1 = (e->state).cpu_tick;
      for (; cpu_tick != 0; cpu_tick = cpu_tick - TVar1) {
        if ((e->state).timer.tima_state == TIMA_STATE_OVERFLOW) {
          (e->state).interrupt.if_ = (e->state).interrupt.if_ | (e->state).interrupt.new_if & 4;
          (e->state).timer.tima = (e->state).timer.tma;
          (e->state).timer.tima_state = TIMA_STATE_RESET;
        }
        else if ((e->state).timer.tima_state == TIMA_STATE_RESET) {
          (e->state).timer.tima_state = TIMA_STATE_NORMAL;
        }
        old_div_counter_00 = (e->state).timer.div_counter;
        (e->state).timer.div_counter = (e->state).timer.div_counter + 4;
        BVar2 = is_div_falling_edge(e,old_div_counter_00,(e->state).timer.div_counter);
        if (BVar2 != FALSE) {
          increment_tima(e);
        }
      }
    }
  }
  return;
}

Assistant:

static void timer_synchronize(Emulator* e) {
  if (TICKS > TIMER.sync_ticks) {
    Ticks delta_ticks = TICKS - TIMER.sync_ticks;
    TIMER.sync_ticks = TICKS;

    if (TIMER.on) {
      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        if (TIMER.tima_state == TIMA_STATE_OVERFLOW) {
          INTR.if_ |= (INTR.new_if & IF_TIMER);
          TIMER.tima = TIMER.tma;
          TIMER.tima_state = TIMA_STATE_RESET;
        } else if (TIMER.tima_state == TIMA_STATE_RESET) {
          TIMER.tima_state = TIMA_STATE_NORMAL;
        }
        u16 old_div_counter = TIMER.div_counter;
        TIMER.div_counter += CPU_TICK;
        if (is_div_falling_edge(e, old_div_counter, TIMER.div_counter)) {
          increment_tima(e);
        }
      }
    } else {
      TIMER.div_counter += delta_ticks;
    }
  }
}